

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

Query * __thiscall
Query::plan(Query *this,
           unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
           *types_to_query)

{
  bool bVar1;
  Query *in_RDX;
  vector<Query,_std::allocator<Query>_> *in_RSI;
  Query *in_RDI;
  QString *in_stack_00000040;
  unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
  *in_stack_00000048;
  Query *query;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Query,_std::allocator<Query>_> *__range2;
  vector<Query,_std::allocator<Query>_> plans;
  vector<Query,_std::allocator<Query>_> *in_stack_ffffffffffffff38;
  Query *__args;
  undefined4 in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  Query *in_stack_ffffffffffffff60;
  __normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_> local_40;
  vector<Query,_std::allocator<Query>_> *local_38;
  unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
  *in_stack_ffffffffffffffe0;
  
  if (*(int *)&(in_RSI->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
               super__Vector_impl_data._M_start == 1) {
    plan_qstring(in_stack_00000048,in_stack_00000040);
  }
  else {
    __args = in_RDI;
    std::vector<Query,_std::allocator<Query>_>::vector
              ((vector<Query,_std::allocator<Query>_> *)0x1a560f);
    local_38 = in_RSI + 2;
    local_40._M_current =
         (Query *)std::vector<Query,_std::allocator<Query>_>::begin(in_stack_ffffffffffffff38);
    std::vector<Query,_std::allocator<Query>_>::end(in_stack_ffffffffffffff38);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_>
                          *)in_RDI,
                         (__normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_>
                          *)in_stack_ffffffffffffff38);
      if (!bVar1) break;
      __gnu_cxx::__normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_>::
      operator*(&local_40);
      plan(in_RDX,in_stack_ffffffffffffffe0);
      std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>(in_RSI,__args);
      ~Query(in_RDI);
      __gnu_cxx::__normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_>::
      operator++(&local_40);
    }
    if (*(int *)&(in_RSI->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
                 super__Vector_impl_data._M_start == 4) {
      Query(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_RSI);
      in_RDI = __args;
    }
    else {
      Query(in_stack_ffffffffffffff60,
            (QueryType *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),in_RSI);
      in_RDI = __args;
    }
    std::vector<Query,_std::allocator<Query>_>::~vector(in_RSI);
  }
  return in_RDI;
}

Assistant:

Query Query::plan(const std::unordered_set<IndexType> &types_to_query) const {
    if (type != QueryType::PRIMITIVE) {
        std::vector<Query> plans;
        for (const auto &query : queries) {
            plans.emplace_back(query.plan(types_to_query));
        }
        if (type == QueryType::MIN_OF) {
            return Query(count, std::move(plans));
        }
        return Query(type, std::move(plans));
    }

    return plan_qstring(types_to_query, value);
}